

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint uivector_resize(uivector *p,size_t size)

{
  ulong uVar1;
  void *pvVar2;
  long in_RSI;
  undefined8 *in_RDI;
  void *data;
  size_t newsize;
  size_t allocsize;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  if ((ulong)in_RDI[2] < (ulong)(in_RSI * 4)) {
    uVar1 = in_RDI[2];
    pvVar2 = lodepng_realloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    in_RDI[2] = in_RSI * 4 + (uVar1 >> 1);
    *in_RDI = pvVar2;
  }
  in_RDI[1] = in_RSI;
  return 1;
}

Assistant:

static unsigned uivector_resize(uivector* p, size_t size) {
  size_t allocsize = size * sizeof(unsigned);
  if (allocsize > p->allocsize) {
    size_t newsize = allocsize + (p->allocsize >> 1u);
    void* data = lodepng_realloc(p->data, newsize);
    if (data) {
      p->allocsize = newsize;
      p->data = (unsigned*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  p->size = size;
  return 1; /*success*/
}